

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_obj.c
# Opt level: O3

void do_pour(CHAR_DATA *ch,char *argument)

{
  int iVar1;
  pointer plVar2;
  bool bVar3;
  char *pcVar4;
  OBJ_DATA *pOVar5;
  OBJ_DATA *obj;
  OBJ_INDEX_DATA *pObjIndex;
  int iVar6;
  OBJ_AFFECT_DATA oaf;
  char buf [4608];
  char arg [4608];
  OBJ_AFFECT_DATA OStack_2478;
  char local_2428 [4608];
  char local_1228 [4608];
  
  pcVar4 = one_argument(argument,local_1228);
  if (local_1228[0] == '\0') {
    pcVar4 = "Pour what on what?\n\r";
  }
  else {
    pOVar5 = get_obj_carry(ch,local_1228,ch);
    if (pOVar5 == (OBJ_DATA *)0x0) {
      pcVar4 = "You don\'t have that item.\n\r";
    }
    else if (pOVar5->item_type == 0x11) {
      if (pOVar5->value[1] == 0) {
        pcVar4 = "It\'s already empty.\n\r";
      }
      else {
        if (*pcVar4 == '\0') {
          pOVar5->value[1] = 0;
          pOVar5->value[3] = 0;
          sprintf(local_2428,"You invert $p, spilling %s all over the ground.",
                  liq_table.super__Vector_base<liq_type,_std::allocator<liq_type>_>._M_impl.
                  super__Vector_impl_data._M_start[pOVar5->value[2]].liq_name);
          act(local_2428,ch,pOVar5,(void *)0x0,3);
          sprintf(local_2428,"$n inverts $p, spilling %s all over the ground.",
                  liq_table.super__Vector_base<liq_type,_std::allocator<liq_type>_>._M_impl.
                  super__Vector_impl_data._M_start[pOVar5->value[2]].liq_name);
          act(local_2428,ch,pOVar5,(void *)0x0,0);
          if ((long)pOVar5->value[2] == 0) {
            bVar3 = is_ground(ch->in_room);
            if (!bVar3) {
              return;
            }
            pObjIndex = get_obj_index(0);
            pOVar5 = create_object(pObjIndex,(int)ch->level);
            obj_to_room(pOVar5,ch->in_room);
            init_affect_obj(&OStack_2478);
            OStack_2478.where = 0;
            OStack_2478.aftype = 0;
            OStack_2478.type = gsn_puddle;
            OStack_2478.modifier = 0;
            OStack_2478.duration = 4;
            OStack_2478.location = 0;
            OStack_2478.end_fun = puddle_evaporate;
            OStack_2478.tick_fun = (OAFF_FUN *)0x0;
            OStack_2478.owner = ch;
            affect_to_obj(pOVar5,&OStack_2478);
            builtin_strncpy(local_2428 + 0x20,"ground.",8);
            builtin_strncpy(local_2428 + 0x10,"a puddle on the ",0x10);
            builtin_strncpy(local_2428,"The water forms ",0x10);
          }
          else {
            sprintf(local_2428,"%s evaporates rapidly and is gone.",
                    liq_table.super__Vector_base<liq_type,_std::allocator<liq_type>_>._M_impl.
                    super__Vector_impl_data._M_start[pOVar5->value[2]].liq_name);
          }
          act(local_2428,ch,(void *)0x0,(void *)0x0,4);
          return;
        }
        obj = get_obj_here(ch,pcVar4);
        plVar2 = liq_table.super__Vector_base<liq_type,_std::allocator<liq_type>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (obj == (OBJ_DATA *)0x0) {
          pcVar4 = "You don\'t see that here.\n\r";
        }
        else {
          if (pOVar5 != obj) {
            iVar6 = liq_table.super__Vector_base<liq_type,_std::allocator<liq_type>_>._M_impl.
                    super__Vector_impl_data._M_start[pOVar5->value[2]].liq_affect[4] * 3;
            iVar1 = pOVar5->value[1];
            if (SBORROW4(iVar1,iVar6) !=
                iVar1 + liq_table.super__Vector_base<liq_type,_std::allocator<liq_type>_>._M_impl.
                        super__Vector_impl_data._M_start[pOVar5->value[2]].liq_affect[4] * -3 < 0) {
              iVar6 = iVar1;
            }
            pOVar5->value[1] = iVar1 - iVar6;
            sprintf(local_2428,"You pour %s from $p onto $P.",plVar2[pOVar5->value[2]].liq_name);
            act(local_2428,ch,pOVar5,obj,3);
            sprintf(local_2428,"$n pours %s from $p onto $P.",
                    liq_table.super__Vector_base<liq_type,_std::allocator<liq_type>_>._M_impl.
                    super__Vector_impl_data._M_start[pOVar5->value[2]].liq_name);
            act(local_2428,ch,pOVar5,obj,0);
            bVar3 = is_affected_by(obj,0);
            if (!bVar3) {
              return;
            }
            act("$p fizzles and is extinguished.",ch,obj,(void *)0x0,4);
            bVar3 = is_affected_obj(obj,(int)gsn_immolate);
            if (!bVar3) {
              return;
            }
            affect_strip_obj(obj,(int)gsn_immolate);
            return;
          }
          pcVar4 = "You cannot pour that on itself.\n\r";
        }
      }
    }
    else {
      pcVar4 = "That\'s not a drink container.\n\r";
    }
  }
  send_to_char(pcVar4,ch);
  return;
}

Assistant:

void do_pour(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_STRING_LENGTH], buf[MAX_STRING_LENGTH];
	OBJ_DATA *out, *on, *puddle;
	OBJ_AFFECT_DATA oaf;
	int amount;

	argument = one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Pour what on what?\n\r", ch);
		return;
	}

	out = get_obj_carry(ch, arg, ch);

	if (out == nullptr)
	{
		send_to_char("You don't have that item.\n\r", ch);
		return;
	}

	if (out->item_type != ITEM_DRINK_CON)
	{
		send_to_char("That's not a drink container.\n\r", ch);
		return;
	}

	if (out->value[1] == 0)
	{
		send_to_char("It's already empty.\n\r", ch);
		return;
	}

	if (argument[0] == '\0')
	{
		out->value[1] = 0;
		out->value[3] = 0;

		sprintf(buf, "You invert $p, spilling %s all over the ground.", liq_table[out->value[2]].liq_name);
		act(buf, ch, out, nullptr, TO_CHAR);

		sprintf(buf, "$n inverts $p, spilling %s all over the ground.", liq_table[out->value[2]].liq_name);
		act(buf, ch, out, nullptr, TO_ROOM);

		if (out->value[2] != LIQ_WATER)
		{
			sprintf(buf, "%s evaporates rapidly and is gone.", liq_table[out->value[2]].liq_name);
			act(buf, ch, 0, 0, TO_ALL);
		}
		else if (is_ground(ch->in_room))
		{
			puddle = create_object(get_obj_index(OBJ_VNUM_PUDDLE), ch->level);
			obj_to_room(puddle, ch->in_room);

			init_affect_obj(&oaf);
			oaf.where = TO_OBJ_AFFECTS;
			oaf.aftype = AFT_SPELL;
			oaf.type = gsn_puddle;
			oaf.location = 0;
			oaf.modifier = 0;
			oaf.duration = 4;
			oaf.owner = ch;
			oaf.end_fun = puddle_evaporate;
			oaf.tick_fun = 0;
			affect_to_obj(puddle, &oaf);

			sprintf(buf, "The water forms a puddle on the ground.");
			act(buf, ch, 0, 0, TO_ALL);
		}

		return;
	}

	on = get_obj_here(ch, argument);

	if (on == nullptr)
	{
		send_to_char("You don't see that here.\n\r", ch);
		return;
	}

	if (out == on)
	{
		send_to_char("You cannot pour that on itself.\n\r", ch);
		return;
	}

	amount = liq_table[out->value[2]].liq_affect[4] * 3;
	amount = std::min(amount, out->value[1]);
	out->value[1] -= amount;

	sprintf(buf, "You pour %s from $p onto $P.", liq_table[out->value[2]].liq_name);
	act(buf, ch, out, on, TO_CHAR);

	sprintf(buf, "$n pours %s from $p onto $P.", liq_table[out->value[2]].liq_name);
	act(buf, ch, out, on, TO_ROOM);

	if (is_affected_by(on, AFF_OBJ_BURNING))
	{
		act("$p fizzles and is extinguished.", ch, on, 0, TO_ALL);

		if (is_affected_obj(on, gsn_immolate))
			affect_strip_obj(on, gsn_immolate);
	}
}